

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::UnserializeFloat(IMkvReader *pReader,longlong pos,longlong size_,double *result)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  double dVar3;
  uchar buf [8];
  undefined8 local_18;
  
  lVar2 = -2;
  if ((-1 < pos && pReader != (IMkvReader *)0x0) && ((size_ == 8 || (size_ == 4)))) {
    local_18 = in_RAX;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size_,&local_18);
    if (iVar1 < 0) {
      lVar2 = (long)iVar1;
    }
    else {
      dVar3 = (double)(local_18 & 0xff);
      lVar2 = 1;
      if (size_ == 4) {
        do {
          dVar3 = (double)((ulong)*(byte *)((long)&local_18 + lVar2) | (long)dVar3 << 8);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        dVar3 = (double)SUB84(dVar3,0);
      }
      else {
        do {
          dVar3 = (double)((long)dVar3 << 8 | (ulong)*(byte *)((long)&local_18 + lVar2));
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
      }
      *result = dVar3;
      lVar2 = -2;
      if (ABS(dVar3) != INFINITY) {
        lVar2 = (ulong)(!NAN(*result) && !NAN(*result)) * 2 + -2;
      }
    }
  }
  return lVar2;
}

Assistant:

long UnserializeFloat(IMkvReader* pReader, long long pos, long long size_,
                      double& result) {
  if (!pReader || pos < 0 || ((size_ != 4) && (size_ != 8)))
    return E_FILE_FORMAT_INVALID;

  const long size = static_cast<long>(size_);

  unsigned char buf[8];

  const int status = pReader->Read(pos, size, buf);

  if (status < 0)  // error
    return status;

  if (size == 4) {
    union {
      float f;
      unsigned long ff;
    };

    ff = 0;

    for (int i = 0;;) {
      ff |= buf[i];

      if (++i >= 4)
        break;

      ff <<= 8;
    }

    result = f;
  } else {
    union {
      double d;
      unsigned long long dd;
    };

    dd = 0;

    for (int i = 0;;) {
      dd |= buf[i];

      if (++i >= 8)
        break;

      dd <<= 8;
    }

    result = d;
  }

  if (mkvparser::isinf(result) || mkvparser::isnan(result))
    return E_FILE_FORMAT_INVALID;

  return 0;
}